

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDop.cpp
# Opt level: O1

KDop<16U> * __thiscall NBvh3::KDop<16U>::operator+=(KDop<16U> *this,SVertex *vertex)

{
  float fVar1;
  uint i;
  long lVar2;
  float dists [8];
  
  dists[0] = vertex->x;
  dists[1] = vertex->y;
  dists[2] = vertex->z;
  dists[3] = dists[0] + dists[1];
  dists[4] = dists[0] + dists[2];
  dists[5] = dists[1] + dists[2];
  dists[6] = dists[0] - dists[1];
  dists[7] = dists[0] - dists[2];
  lVar2 = 0;
  do {
    fVar1 = dists[lVar2];
    if (this->mMax[lVar2] <= fVar1 && fVar1 != this->mMax[lVar2]) {
      this->mMax[lVar2] = fVar1;
    }
    if (fVar1 < this->mMin[lVar2]) {
      this->mMin[lVar2] = fVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return this;
}

Assistant:

KDop<K>& KDop<K>::operator += (const SVertex& vertex)
{
    float dists[K / 2];
    getDistances<K / 2>(vertex, dists);
    for(unsigned i = 0; i < K / 2; ++i)
    {
        setMinMax(dists[i], mMin[i], mMax[i]);
    }

    return *this;
}